

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O0

long __thiscall dlib::drawable::right(drawable *this)

{
  long lVar1;
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffc8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffc8);
  lVar1 = rectangle::right((rectangle *)&in_RDI->r);
  auto_mutex::~auto_mutex((auto_mutex *)0x458f1e);
  return lVar1;
}

Assistant:

long right (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.right(); 
        }